

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extAddPairwiseToUI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *pLVar1;
  uint uVar2;
  uint uVar3;
  Literal *in_RDX;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  long lVar4;
  Literal *this_01;
  undefined1 local_178 [8];
  LaneArray<4_*_2> lanes;
  LaneArray<4> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  this_01 = (Literal *)local_178;
  local_38 = __return_storage_ptr__;
  getLanes<unsigned_short,8>((LaneArray<8> *)this_01,(wasm *)this,in_RDX);
  lanes._M_elems[7].type.id = 0;
  for (lVar4 = 0; pLVar1 = local_38, lVar4 != 0x60; lVar4 = lVar4 + 0x18) {
    uVar2 = geti32(this_01);
    uVar3 = geti32(this_01 + 1);
    local_50.i32 = (uVar3 & 0xffff) + (uVar2 & 0xffff);
    local_40 = 2;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)result._M_elems + lVar4 + -8);
    if (this_00 != &local_50) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_50.func);
    }
    ~Literal((Literal *)&local_50.func);
    this_01 = this_01 + 2;
  }
  Literal(local_38,(LaneArray<4> *)&lanes._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&lanes._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_178);
  return pLVar1;
}

Assistant:

Literal Literal::extAddPairwiseToUI32x4() const {
  return extAddPairwise<4, uint16_t, uint32_t>(*this);
}